

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::ExclusiveJoinPromiseNode::tracePromise
          (ExclusiveJoinPromiseNode *this,TraceBuilder *builder,bool stopAtNextEvent)

{
  undefined7 in_register_00000011;
  PromiseNode *pPVar1;
  
  if (((int)CONCAT71(in_register_00000011,stopAtNextEvent) == 0) &&
     ((pPVar1 = (this->left).dependency.ptr, pPVar1 != (PromiseNode *)0x0 ||
      (pPVar1 = (this->right).dependency.ptr, pPVar1 != (PromiseNode *)0x0)))) {
    (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar1,builder,0);
    return;
  }
  return;
}

Assistant:

void ExclusiveJoinPromiseNode::tracePromise(TraceBuilder& builder, bool stopAtNextEvent) {
  // TODO(debug): Maybe use __builtin_return_address to get the locations that called
  //   exclusiveJoin()?

  if (stopAtNextEvent) return;

  // Trace the left branch I guess.
  if (left.dependency.get() != nullptr) {
    left.dependency->tracePromise(builder, false);
  } else if (right.dependency.get() != nullptr) {
    right.dependency->tracePromise(builder, false);
  }
}